

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O2

int Acec_MatchBoxes(Acec_Box_t *pBox0,Acec_Box_t *pBox1)

{
  int *piVar1;
  Gia_Man_t *pGia0;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  int *piVar13;
  int iVar14;
  Gia_Man_t *pTwo;
  Vec_Int_t *p_01;
  int *piVar15;
  Vec_Int_t *vMap1;
  Vec_Int_t *vMap0;
  
  pTwo = pBox1->pGia;
  Acec_ComputeEquivClasses(pBox0->pGia,pTwo,&vMap0,&vMap1);
  for (iVar12 = 0; iVar12 < pBox0->vLeafLits->nSize; iVar12 = iVar12 + 1) {
    pVVar5 = Vec_WecEntry(pBox0->vLeafLits,iVar12);
    pTwo = (Gia_Man_t *)(ulong)(uint)pVVar5->nSize;
    Acec_MatchBoxesSort(pVVar5->pArray,pVVar5->nSize,vMap0->pArray);
  }
  for (iVar12 = 0; pGia0 = (Gia_Man_t *)pBox1->vLeafLits, iVar12 < *(int *)((long)&pGia0->pName + 4)
      ; iVar12 = iVar12 + 1) {
    pVVar5 = Vec_WecEntry((Vec_Wec_t *)pGia0,iVar12);
    pTwo = (Gia_Man_t *)(ulong)(uint)pVVar5->nSize;
    Acec_MatchBoxesSort(pVVar5->pArray,pVVar5->nSize,vMap1->pArray);
  }
  Acec_MatchCheckShift
            (pGia0,pTwo,pBox0->vLeafLits,(Vec_Wec_t *)pGia0,vMap0,vMap1,pBox0->vRootLits,
             pBox1->vRootLits);
  if (pBox0->vShared != (Vec_Wec_t *)0x0) {
    __assert_fail("pBox0->vShared == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCore.c"
                  ,0x19e,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
  }
  if (pBox1->vShared != (Vec_Wec_t *)0x0) {
    __assert_fail("pBox1->vShared == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCore.c"
                  ,0x19f,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
  }
  pVVar6 = Vec_WecStart(pBox0->vLeafLits->nSize);
  pBox0->vShared = pVVar6;
  pVVar6 = Vec_WecStart(pBox1->vLeafLits->nSize);
  pBox1->vShared = pVVar6;
  pVVar6 = Vec_WecStart(pBox0->vLeafLits->nSize);
  pBox0->vUnique = pVVar6;
  pVVar6 = Vec_WecStart(pBox1->vLeafLits->nSize);
  pBox1->vUnique = pVVar6;
  pVVar6 = pBox0->vLeafLits;
  iVar2 = pVVar6->nSize;
  iVar12 = pBox1->vLeafLits->nSize;
  iVar10 = iVar12;
  if (iVar2 < iVar12) {
    iVar12 = iVar2;
    iVar10 = iVar2;
  }
  for (; iVar14 = iVar10, iVar12 < iVar2; iVar12 = iVar12 + 1) {
    pVVar5 = Vec_WecEntry(pVVar6,iVar12);
    pVVar7 = Vec_WecEntry(pBox0->vUnique,iVar12);
    Vec_IntAppend(pVVar7,pVVar5);
    pVVar6 = pBox0->vLeafLits;
    iVar2 = pVVar6->nSize;
  }
  for (; iVar14 < pBox1->vLeafLits->nSize; iVar14 = iVar14 + 1) {
    pVVar5 = Vec_WecEntry(pBox1->vLeafLits,iVar14);
    pVVar7 = Vec_WecEntry(pBox1->vUnique,iVar14);
    Vec_IntAppend(pVVar7,pVVar5);
  }
  iVar12 = 0;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  do {
    if (iVar12 == iVar10) {
      uVar3 = Vec_WecSizeSize(pBox0->vShared);
      uVar4 = Vec_WecSizeSize(pBox0->vLeafLits);
      printf("Box0: Matched %d entries out of %d.\n",(ulong)uVar3,(ulong)uVar4);
      uVar4 = Vec_WecSizeSize(pBox1->vLeafLits);
      printf("Box1: Matched %d entries out of %d.\n",(ulong)uVar3,(ulong)uVar4);
      Vec_IntFree(vMap0);
      Vec_IntFree(vMap1);
      return uVar3;
    }
    pVVar5 = Vec_WecEntry(pBox0->vShared,iVar12);
    pVVar7 = Vec_WecEntry(pBox1->vShared,iVar12);
    p = Vec_WecEntry(pBox0->vUnique,iVar12);
    p_00 = Vec_WecEntry(pBox1->vUnique,iVar12);
    pVVar8 = Vec_WecEntry(pBox0->vLeafLits,iVar12);
    pVVar9 = Vec_WecEntry(pBox1->vLeafLits,iVar12);
    piVar15 = pVVar8->pArray;
    piVar13 = pVVar9->pArray;
    piVar1 = piVar15 + pVVar8->nSize;
    piVar11 = piVar13 + pVVar9->nSize;
    while ((piVar15 < piVar1 && (piVar13 < piVar11))) {
      uVar3 = Abc_Lit2LitL(vMap0->pArray,*piVar15);
      uVar4 = Abc_Lit2LitL(vMap1->pArray,*piVar13);
      iVar2 = *piVar15;
      if ((iVar2 == 0) || (iVar14 = *piVar13, iVar14 == 0)) {
        __assert_fail("*pBeg0 && *pBeg1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCore.c"
                      ,0x1ba,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
      }
      if (uVar3 == uVar4) {
        piVar15 = piVar15 + 1;
        Vec_IntPush(pVVar5,iVar2);
        iVar14 = *piVar13;
        p_01 = pVVar7;
LAB_0052e2cf:
        Vec_IntPush(p_01,iVar14);
        piVar13 = piVar13 + 1;
      }
      else {
        p_01 = p_00;
        if (uVar3 <= uVar4) goto LAB_0052e2cf;
        piVar15 = piVar15 + 1;
        Vec_IntPush(p,iVar2);
      }
    }
    for (; piVar15 < piVar1; piVar15 = piVar15 + 1) {
      Vec_IntPush(p,*piVar15);
    }
    for (; piVar13 < piVar11; piVar13 = piVar13 + 1) {
      Vec_IntPush(p_00,*piVar13);
    }
    iVar2 = pVVar5->nSize;
    if (iVar2 != pVVar7->nSize) {
      __assert_fail("Vec_IntSize(vShared0) == Vec_IntSize(vShared1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCore.c"
                    ,0x1c9,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
    }
    if (p->nSize + iVar2 != pVVar8->nSize) {
      __assert_fail("Vec_IntSize(vShared0) + Vec_IntSize(vUnique0) == Vec_IntSize(vLevel0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCore.c"
                    ,0x1ca,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
    }
    iVar12 = iVar12 + 1;
    if (iVar2 + p_00->nSize != pVVar9->nSize) {
      __assert_fail("Vec_IntSize(vShared1) + Vec_IntSize(vUnique1) == Vec_IntSize(vLevel1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCore.c"
                    ,0x1cb,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
    }
  } while( true );
}

Assistant:

int Acec_MatchBoxes( Acec_Box_t * pBox0, Acec_Box_t * pBox1 )
{
    Vec_Int_t * vMap0, * vMap1, * vLevel; 
    int i, nSize, nTotal;
    Acec_ComputeEquivClasses( pBox0->pGia, pBox1->pGia, &vMap0, &vMap1 );
    // sort nodes in the classes by their equivalences
    Vec_WecForEachLevel( pBox0->vLeafLits, vLevel, i )
        Acec_MatchBoxesSort( Vec_IntArray(vLevel), Vec_IntSize(vLevel), Vec_IntArray(vMap0) );
    Vec_WecForEachLevel( pBox1->vLeafLits, vLevel, i )
        Acec_MatchBoxesSort( Vec_IntArray(vLevel), Vec_IntSize(vLevel), Vec_IntArray(vMap1) );
    Acec_MatchCheckShift( pBox0->pGia, pBox1->pGia, pBox0->vLeafLits, pBox1->vLeafLits, vMap0, vMap1, pBox0->vRootLits, pBox1->vRootLits );
    
    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vLeafLits, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vLeafLits, Vec_IntArray(vMap1), 0 );
    //printf( "Outputs:\n" );
    //Vec_WecPrintLits( pBox0->vRootLits );
    //printf( "Outputs:\n" );
    //Vec_WecPrintLits( pBox1->vRootLits );

    // reorder nodes to have the same order
    assert( pBox0->vShared == NULL );
    assert( pBox1->vShared == NULL );
    pBox0->vShared = Vec_WecStart( Vec_WecSize(pBox0->vLeafLits) );
    pBox1->vShared = Vec_WecStart( Vec_WecSize(pBox1->vLeafLits) );
    pBox0->vUnique = Vec_WecStart( Vec_WecSize(pBox0->vLeafLits) );
    pBox1->vUnique = Vec_WecStart( Vec_WecSize(pBox1->vLeafLits) );
    nSize = Abc_MinInt( Vec_WecSize(pBox0->vLeafLits), Vec_WecSize(pBox1->vLeafLits) );
    Vec_WecForEachLevelStart( pBox0->vLeafLits, vLevel, i, nSize )
        Vec_IntAppend( Vec_WecEntry(pBox0->vUnique, i), vLevel );
    Vec_WecForEachLevelStart( pBox1->vLeafLits, vLevel, i, nSize )
        Vec_IntAppend( Vec_WecEntry(pBox1->vUnique, i), vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        Vec_Int_t * vShared0 = Vec_WecEntry( pBox0->vShared, i );
        Vec_Int_t * vShared1 = Vec_WecEntry( pBox1->vShared, i );
        Vec_Int_t * vUnique0 = Vec_WecEntry( pBox0->vUnique, i );
        Vec_Int_t * vUnique1 = Vec_WecEntry( pBox1->vUnique, i );

        Vec_Int_t * vLevel0 = Vec_WecEntry( pBox0->vLeafLits, i );
        Vec_Int_t * vLevel1 = Vec_WecEntry( pBox1->vLeafLits, i );
        int * pBeg0 = Vec_IntArray(vLevel0);
        int * pBeg1 = Vec_IntArray(vLevel1);
        int * pEnd0 = Vec_IntLimit(vLevel0);
        int * pEnd1 = Vec_IntLimit(vLevel1);
        while ( pBeg0 < pEnd0 && pBeg1 < pEnd1 )
        {
            int Entry0 = Abc_Lit2LitL( Vec_IntArray(vMap0), *pBeg0 );
            int Entry1 = Abc_Lit2LitL( Vec_IntArray(vMap1), *pBeg1 );
            assert( *pBeg0 && *pBeg1 );
            if ( Entry0 == Entry1 )
            {
                Vec_IntPush( vShared0, *pBeg0++ );
                Vec_IntPush( vShared1, *pBeg1++ );
            }
            else if ( Entry0 > Entry1 )
                Vec_IntPush( vUnique0, *pBeg0++ );
            else 
                Vec_IntPush( vUnique1, *pBeg1++ );
        }
        while ( pBeg0 < pEnd0 )
            Vec_IntPush( vUnique0, *pBeg0++ );
        while ( pBeg1 < pEnd1 )
            Vec_IntPush( vUnique1, *pBeg1++ );
        assert( Vec_IntSize(vShared0) == Vec_IntSize(vShared1) );
        assert( Vec_IntSize(vShared0) + Vec_IntSize(vUnique0) == Vec_IntSize(vLevel0) );
        assert( Vec_IntSize(vShared1) + Vec_IntSize(vUnique1) == Vec_IntSize(vLevel1) );
    }
    nTotal = Vec_WecSizeSize(pBox0->vShared);
    printf( "Box0: Matched %d entries out of %d.\n", nTotal, Vec_WecSizeSize(pBox0->vLeafLits) );
    printf( "Box1: Matched %d entries out of %d.\n", nTotal, Vec_WecSizeSize(pBox1->vLeafLits) );

    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vShared, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vShared, Vec_IntArray(vMap1), 0 );
    //printf( "\n" );

    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vUnique, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vUnique, Vec_IntArray(vMap1), 0 );

    Vec_IntFree( vMap0 );
    Vec_IntFree( vMap1 );
    return nTotal;
}